

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Region.cpp
# Opt level: O0

Region * Region::New(RegionType type,Region *parent,Func *func)

{
  JitArenaAllocator *pJVar1;
  Region *this;
  LabelInstr *pLVar2;
  TrackAllocData local_50;
  Region *local_28;
  Region *region;
  Func *func_local;
  Region *parent_local;
  RegionType type_local;
  
  pJVar1 = func->m_alloc;
  region = (Region *)func;
  func_local = (Func *)parent;
  parent_local._7_1_ = type;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_50,(type_info *)&typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Region.cpp"
             ,10);
  pJVar1 = (JitArenaAllocator *)
           Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                          pJVar1,&local_50);
  this = (Region *)new<Memory::JitArenaAllocator>(0x70,pJVar1,0x4e98c0);
  Region(this);
  this->type = parent_local._7_1_;
  this->parent = (Region *)func_local;
  local_28 = this;
  pLVar2 = IR::LabelInstr::New(Label,(Func *)region,true);
  local_28->bailoutReturnThunkLabel = pLVar2;
  if (parent_local._7_1_ == RegionTypeTry) {
    local_28->selfOrFirstTryAncestor = local_28;
  }
  return local_28;
}

Assistant:

Region *
Region::New(RegionType type, Region * parent, Func * func)
{
    Region * region = JitAnew(func->m_alloc, Region);

    region->type = type;
    region->parent = parent;
    region->bailoutReturnThunkLabel = IR::LabelInstr::New(Js::OpCode::Label, func, true);
    if (type == RegionTypeTry)
    {
        region->selfOrFirstTryAncestor = region;
    }
    return region;
}